

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::memory<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined8 *puVar1;
  Type TVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  size_t sVar5;
  pointer pcVar6;
  pointer pcVar7;
  MemType type;
  bool bVar8;
  _Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *p_Var9;
  undefined4 *puVar10;
  vector<char,_std::allocator<char>_> *__u;
  _Alloc_hider _Var11;
  ImportNames *exports_00;
  ImportNames *import_00;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  Name name;
  undefined1 local_1f0 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  MaybeResult<wasm::WATParser::ImportNames> import;
  undefined8 local_190;
  string local_180;
  string local_160;
  undefined1 *local_140;
  uint64_t uStack_138;
  unsigned_long local_130;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  optional<std::vector<char,_std::allocator<char>_>_> data;
  Type local_d0;
  unsigned_long local_c8;
  undefined3 local_c0;
  undefined1 uStack_bd;
  undefined3 uStack_bc;
  undefined4 local_b8;
  undefined3 uStack_b4;
  Type local_b0;
  uint64_t local_98;
  undefined1 local_90 [8];
  Result<std::vector<char,_std::allocator<char>_>_> _val_2;
  undefined1 local_60 [8];
  optional<wasm::Name> id;
  undefined1 local_40 [8];
  __index_type local_38;
  
  sVar5 = (ctx->in).pos;
  expected._M_str = "memory";
  expected._M_len = 6;
  bVar8 = Lexer::takeSExprStart(&ctx->in,expected);
  if (!bVar8) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)local_60,&ctx->in);
  if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
    data.super__Optional_base<std::vector<char,_std::allocator<char>_>,_false,_false>._M_payload.
    super__Optional_payload<std::vector<char,_std::allocator<char>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<char,_std::allocator<char>_>_>._M_engaged = false;
    data.super__Optional_base<std::vector<char,_std::allocator<char>_>,_false,_false>._M_payload.
    super__Optional_payload<std::vector<char,_std::allocator<char>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<char,_std::allocator<char>_>_>._25_7_ = 0;
    local_d0.id = 0;
  }
  else {
    data.super__Optional_base<std::vector<char,_std::allocator<char>_>,_false,_false>._M_payload.
    super__Optional_payload<std::vector<char,_std::allocator<char>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<char,_std::allocator<char>_>_>._24_8_ =
         id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
    local_d0.id = (uintptr_t)local_60;
  }
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_1f0,&ctx->in)
  ;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_60,
                  (_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_1f0);
  if ((bool)local_40[0] == true) {
    TVar2.id = (long)&_val_2.val.
                      super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                      super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 8;
    local_90 = (undefined1  [8])TVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_60,
               (undefined1 *)
               (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                _M_len + (long)local_60));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
    if (local_90 == (undefined1  [8])TVar2.id) {
      *puVar1 = CONCAT71(_val_2.val.
                         super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                         super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                         super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._9_7_,
                         _val_2.val.
                         super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                         super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                         super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._M_first.
                         _M_storage._M_storage[8]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           _val_2.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(_val_2.val.
                    super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                    super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._9_7_,
                    _val_2.val.
                    super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                    super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._M_first.
                    _M_storage._M_storage[8]);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         _val_2.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
         super__Move_assign_alias<std::vector<char>,_wasm::Err>.
         super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
         super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
         super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
         super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       *)local_60);
    goto LAB_00b82e7c;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_60);
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)
               ((long)&exports.val.
                       super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),&ctx->in);
  import_00 = (ImportNames *)
              ((long)&exports.val.
                      super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)local_60
             ,(_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
              import_00);
  if (local_40[0] == '\x02') {
    TVar2.id = (long)&_val_2.val.
                      super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                      super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 8;
    local_90 = (undefined1  [8])TVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_60,
               (undefined1 *)
               (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                _M_len + (long)local_60));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
    if (local_90 == (undefined1  [8])TVar2.id) {
      *puVar1 = CONCAT71(_val_2.val.
                         super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                         super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                         super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._9_7_,
                         _val_2.val.
                         super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                         super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                         super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._M_first.
                         _M_storage._M_storage[8]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           _val_2.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(_val_2.val.
                    super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                    super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._9_7_,
                    _val_2.val.
                    super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                    super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._M_first.
                    _M_storage._M_storage[8]);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         _val_2.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
         super__Move_assign_alias<std::vector<char>,_wasm::Err>.
         super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
         super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
         super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
         super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               local_60);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               local_60);
    local_b0.id = 3;
    expected_00._M_str = "i64";
    expected_00._M_len = 3;
    bVar8 = Lexer::takeKeyword(&ctx->in,expected_00);
    if (!bVar8) {
      local_b0.id = 2;
      expected_01._M_str = "i32";
      expected_01._M_len = 3;
      Lexer::takeKeyword(&ctx->in,expected_01);
    }
    data.super__Optional_base<std::vector<char,_std::allocator<char>_>,_false,_false>._M_payload.
    super__Optional_payload<std::vector<char,_std::allocator<char>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<char,_std::allocator<char>_>_>._M_payload._16_1_ = 0;
    expected_02._M_str = "data";
    expected_02._M_len = 4;
    bVar8 = Lexer::takeSExprStart(&ctx->in,expected_02);
    if (bVar8) {
      if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u.
          _24_1_ == '\x01') {
        datastring<wasm::WATParser::ParseDeclsCtx>
                  ((Result<std::vector<char,_std::allocator<char>_>_> *)local_60,ctx);
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err> *)
                   local_90,(_Copy_ctor_base<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                             *)local_60);
        if (_val_2.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
            super__Move_assign_alias<std::vector<char>,_wasm::Err>.
            super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
            super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
            super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._24_1_ == '\x01') {
          local_118 = &local_108;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,local_90,
                     (undefined1 *)
                     (_val_2.val.
                      super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                      super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                      super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._0_8_ +
                     (long)local_90));
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
          if (local_118 == &local_108) {
            *puVar1 = local_108;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 uStack_100;
          }
          else {
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_118;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
                 local_108;
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_110;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          std::__detail::__variant::
          _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                             *)local_90);
        }
        else {
          std::__detail::__variant::
          _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                             *)local_90);
          bVar8 = Lexer::takeRParen(&ctx->in);
          if (bVar8) {
            __u = (vector<char,_std::allocator<char>_> *)0x0;
            if ((bool)local_40[0] == false) {
              __u = (vector<char,_std::allocator<char>_> *)local_60;
            }
            pcVar6 = (__u->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pcVar7 = (__u->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            std::optional<std::vector<char,std::allocator<char>>>::operator=
                      ((optional<std::vector<char,std::allocator<char>>> *)local_f8,__u);
            local_c8 = (ulong)(pcVar7 + (0xffff - (long)pcVar6)) >> 0x10;
            std::__detail::__variant::
            _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                               *)local_60);
            uVar3 = 1;
            uVar4 = 0;
            local_98 = local_c8;
            goto LAB_00b82a14;
          }
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_180,"expected end of inline data","");
          Lexer::err((Err *)local_90,&ctx->in,&local_180);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
          TVar2.id = (long)&_val_2.val.
                            super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                            .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                            super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                            super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                            super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 8;
          if (local_90 == (undefined1  [8])TVar2.id) {
            *puVar1 = CONCAT71(_val_2.val.
                               super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                               super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                               super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                               super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._9_7_
                               ,_val_2.val.
                                super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                                super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u.
                                _M_first._M_storage._M_storage[8]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 _val_2.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(_val_2.val.
                            super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                            .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                            super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                            super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                            super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                            super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._9_7_,
                            _val_2.val.
                            super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                            .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                            super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                            super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                            super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                            super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._M_first
                            ._M_storage._M_storage[8]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
               _val_2.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
               super__Move_assign_alias<std::vector<char>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
               super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._0_8_;
          _val_2.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
          super__Move_assign_alias<std::vector<char>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._0_8_ = 0;
          _val_2.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
          super__Move_assign_alias<std::vector<char>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._M_first._M_storage.
          _M_storage[8] = '\0';
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          local_90 = (undefined1  [8])TVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                           *)local_60);
      }
      else {
        import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._32_8_ =
             &stack0xfffffffffffffe70;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   ((long)&import.val.
                           super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                   + 0x20),"imported memories cannot have inline data","");
        Lexer::err((Err *)local_60,&ctx->in,
                   (string *)
                   ((long)&import.val.
                           super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                   + 0x20));
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
        TVar2.id = (long)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::Name>._M_payload + 8;
        if (local_60 == (undefined1  [8])TVar2.id) {
          *puVar1 = CONCAT71(id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                             id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
               id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_60;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
        }
        *(size_t *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
             id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len = 0;
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        _Var11._M_p = (pointer)import.val.
                               super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                               .
                               super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                               .
                               super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                               .
                               super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                               .
                               super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                               ._32_8_;
        local_60 = (undefined1  [8])TVar2.id;
        if ((undefined8 *)
            import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._32_8_
            != &stack0xfffffffffffffe70) {
LAB_00b82d9e:
          local_60 = (undefined1  [8])
                     ((long)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::Name>._M_payload + 8);
          id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_payload._8_1_ = 0;
          id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len = 0;
          operator_delete(_Var11._M_p,local_190 + 1);
        }
      }
    }
    else {
      memtypeContinued<wasm::WATParser::ParseDeclsCtx>
                ((Result<wasm::WATParser::MemType> *)local_60,ctx,local_b0);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::MemType,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::MemType,_wasm::Err> *)local_90,
                      (_Copy_ctor_base<false,_wasm::WATParser::MemType,_wasm::Err> *)local_60);
      if (_val_2.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
          super__Move_assign_alias<std::vector<char>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_index == '\x01') {
        local_118 = &local_108;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,local_90,
                   (undefined1 *)
                   (_val_2.val.
                    super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                    super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                    super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                    super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._0_8_ +
                   (long)local_90));
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
        if (local_118 == &local_108) {
          *puVar1 = local_108;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
               uStack_100;
        }
        else {
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_118;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) = local_108
          ;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_110;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)local_90);
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)local_60);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)local_90);
        bVar8 = local_38 == '\0';
        p_Var9 = (_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)0x0;
        if (bVar8) {
          p_Var9 = (_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)local_60;
        }
        local_b0.id = (uintptr_t)local_60;
        local_98 = (p_Var9->_M_u)._M_first._M_storage.limits.initial;
        local_c8 = (p_Var9->_M_u)._M_first._M_storage.limits.max.
                   super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_payload._M_value;
        uVar3 = *(undefined1 *)((long)&p_Var9->_M_u + 0x18);
        puVar10 = (undefined4 *)&DAT_00000019;
        if (bVar8) {
          puVar10 = (undefined4 *)
                    &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>.field_0x11;
        }
        local_c0 = (undefined3)*puVar10;
        uStack_bd = (undefined1)*(undefined4 *)((long)puVar10 + 3);
        uStack_bc = (undefined3)((uint)*(undefined4 *)((long)puVar10 + 3) >> 8);
        uVar4 = *(undefined1 *)((long)&p_Var9->_M_u + 0x20);
        puVar10 = (undefined4 *)&DAT_00000021;
        if (bVar8) {
          puVar10 = (undefined4 *)((long)local_40 + 1);
        }
        local_b8 = *puVar10;
        uStack_b4 = (undefined3)((uint)*(undefined4 *)((long)puVar10 + 3) >> 8);
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::MemType,_wasm::Err> *)local_60);
LAB_00b82a14:
        bVar8 = Lexer::takeRParen(&ctx->in);
        if (bVar8) {
          exports_00 = (ImportNames *)local_1f0;
          if (exports.val.
              super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
              super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._24_1_ != '\0')
          {
            exports_00 = (ImportNames *)0x0;
          }
          if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u
              ._24_1_ != '\0') {
            import_00 = (ImportNames *)0x0;
          }
          local_140 = (undefined1 *)local_b0.id;
          uStack_138 = local_98;
          local_130 = local_c8;
          uStack_124 = CONCAT31(uStack_bc,uStack_bd);
          uStack_128 = CONCAT31((int3)_local_c0,uVar3);
          uStack_11c = CONCAT31(uStack_b4,local_b8._3_1_);
          local_120._1_3_ = (undefined3)local_b8;
          local_120 = CONCAT31(local_120._1_3_,uVar4);
          type._36_4_ = uStack_11c;
          type._32_4_ = local_120;
          type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._12_4_ = uStack_124;
          type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._8_4_ = uStack_128;
          type.limits.initial = local_98;
          type.addressType.id = local_b0.id;
          type.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_c8;
          name.super_IString.str._M_str =
               (char *)data.
                       super__Optional_base<std::vector<char,_std::allocator<char>_>,_false,_false>.
                       _M_payload.
                       super__Optional_payload<std::vector<char,_std::allocator<char>_>,_true,_false,_false>
                       .super__Optional_payload_base<std::vector<char,_std::allocator<char>_>_>.
                       _24_8_;
          name.super_IString.str._M_len = local_d0.id;
          ParseDeclsCtx::addMemory
                    ((Result<wasm::Ok> *)local_60,ctx,name,
                     (vector<wasm::Name,_std::allocator<wasm::Name>_> *)exports_00,import_00,type,
                     (Index)sVar5);
          if ((bool)local_40[0] == true) {
            local_90 = (undefined1  [8])
                       ((long)&_val_2.val.
                               super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                               super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                               super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,local_60,
                       (undefined1 *)
                       (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.
                        str._M_len + (long)local_60));
LAB_00b82b1f:
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
            if (local_90 ==
                (undefined1  [8])
                ((long)&_val_2.val.
                        super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                        super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 8U)) {
              *puVar1 = CONCAT71(_val_2.val.
                                 super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                 .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                 super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                 super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                 super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                                 super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u.
                                 _9_7_,_val_2.val.
                                       super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                       .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                       super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                       super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                       super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                                       super__Variant_storage_alias<std::vector<char>,_wasm::Err>.
                                       _M_u._M_first._M_storage._M_storage[8]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                   _val_2.val.
                   super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                   super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._16_8_;
            }
            else {
              *(undefined1 (*) [8])
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_90;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10
                        ) = CONCAT71(_val_2.val.
                                     super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                     .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                     super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                     super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                     super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                                     super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u
                                     ._9_7_,_val_2.val.
                                            super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                            .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                            super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                            super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                            super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                                            super__Variant_storage_alias<std::vector<char>,_wasm::Err>
                                            ._M_u._M_first._M_storage._M_storage[8]);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                 _val_2.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._0_8_;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
            if (data.super__Optional_base<std::vector<char,_std::allocator<char>_>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::vector<char,_std::allocator<char>_>,_true,_false,_false>
                .super__Optional_payload_base<std::vector<char,_std::allocator<char>_>_>._M_payload.
                _16_1_ == '\x01') {
              ParseDeclsCtx::addImplicitData
                        ((Result<wasm::Ok> *)local_60,ctx,(DataStringT *)local_f8);
              if ((bool)local_40[0] == true) {
                local_90 = (undefined1  [8])
                           ((long)&_val_2.val.
                                   super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                   .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                   super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                   super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                   super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 8);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_90,local_60,
                           (undefined1 *)
                           (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_payload._M_value.
                            super_IString.str._M_len + (long)local_60));
                goto LAB_00b82b1f;
              }
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_60);
            }
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
          }
        }
        else {
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_160,"expected end of memory declaration","");
          Lexer::err((Err *)local_60,&ctx->in,&local_160);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
          TVar2.id = (long)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_payload + 8;
          if (local_60 == (undefined1  [8])TVar2.id) {
            *puVar1 = CONCAT71(id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                               id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_60;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                            id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
          }
          *(size_t *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
               id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
          ;
          id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len = 0;
          id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_payload._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          local_190 = local_160.field_2._M_allocated_capacity;
          _Var11._M_p = local_160._M_dataplus._M_p;
          local_60 = (undefined1  [8])TVar2.id;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) goto LAB_00b82d9e;
        }
      }
    }
    if ((data.super__Optional_base<std::vector<char,_std::allocator<char>_>,_false,_false>.
         _M_payload.
         super__Optional_payload<std::vector<char,_std::allocator<char>_>,_true,_false,_false>.
         super__Optional_payload_base<std::vector<char,_std::allocator<char>_>_>._M_payload._16_1_
         == '\x01') &&
       (data.super__Optional_base<std::vector<char,_std::allocator<char>_>,_false,_false>._M_payload
        .super__Optional_payload<std::vector<char,_std::allocator<char>_>,_true,_false,_false>.
        super__Optional_payload_base<std::vector<char,_std::allocator<char>_>_>._M_payload._16_1_ =
             0, local_f8 != (undefined1  [8])0x0)) {
      operator_delete((void *)local_f8,
                      (long)data.
                            super__Optional_base<std::vector<char,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<char,_std::allocator<char>_>,_true,_false,_false>
                            .super__Optional_payload_base<std::vector<char,_std::allocator<char>_>_>
                            ._M_payload._M_value.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_f8);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
             ((long)&exports.val.
                     super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
LAB_00b82e7c:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_1f0);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> memory(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("memory"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto addressType = Type::i32;
  if (ctx.in.takeKeyword("i64"sv)) {
    addressType = Type::i64;
  } else {
    ctx.in.takeKeyword("i32"sv);
  }

  std::optional<typename Ctx::MemTypeT> mtype;
  std::optional<typename Ctx::DataStringT> data;
  if (ctx.in.takeSExprStart("data"sv)) {
    if (import) {
      return ctx.in.err("imported memories cannot have inline data");
    }
    auto datastr = datastring(ctx);
    CHECK_ERR(datastr);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of inline data");
    }
    mtype =
      ctx.makeMemType(addressType, ctx.getLimitsFromData(*datastr), false);
    data = *datastr;
  } else {
    auto type = memtypeContinued(ctx, addressType);
    CHECK_ERR(type);
    mtype = *type;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of memory declaration");
  }

  CHECK_ERR(ctx.addMemory(name, *exports, import.getPtr(), *mtype, pos));

  if (data) {
    CHECK_ERR(ctx.addImplicitData(std::move(*data)));
  }

  return Ok{};
}